

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTPNArglist * __thiscall CTcPrsOpBinGroupCompare::parse_inlist(CTcPrsOpBinGroupCompare *this)

{
  undefined1 *puVar1;
  tc_toktyp_t tVar2;
  CTcPrsNode *pCVar3;
  CTPNArg *pCVar4;
  ulong uVar5;
  CTPNArg *pCVar6;
  CTPNArg *pCVar7;
  int iVar8;
  CTPNArglist *unaff_R14;
  CTPNArg *local_48;
  int local_3c;
  
  tVar2 = CTcTokenizer::next(G_tok);
  if (tVar2 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2ba3);
  }
  local_48 = (CTPNArg *)0x0;
  local_3c = 0;
  pCVar6 = (CTPNArg *)0x0;
  do {
    pCVar4 = pCVar6;
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
LAB_00230be0:
      iVar8 = 2;
    }
    else {
      pCVar3 = CTcPrsOpAsi::parse(&S_op_asi);
      iVar8 = 1;
      if (pCVar3 == (CTcPrsNode *)0x0) {
        unaff_R14 = (CTPNArglist *)0x0;
        iVar8 = 1;
      }
      else {
        pCVar4 = (CTPNArg *)CTcPrsMem::alloc(G_prsmem,0x48);
        (pCVar4->super_CTPNArgBase).arg_expr_ = pCVar3;
        (pCVar4->super_CTPNArgBase).next_arg_ = (CTPNArg *)0x0;
        puVar1 = &(pCVar4->super_CTPNArgBase).field_0x40;
        *puVar1 = *puVar1 & 0xfe;
        (pCVar4->super_CTPNArgBase).name_.typ_ = TOKT_INVALID;
        (pCVar4->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
             (_func_int **)&PTR_gen_code_00362fd8;
        pCVar7 = pCVar4;
        if (pCVar6 != (CTPNArg *)0x0) {
          (pCVar6->super_CTPNArgBase).next_arg_ = pCVar4;
          pCVar7 = local_48;
        }
        local_3c = local_3c + 1;
        uVar5 = (ulong)(G_tok->curtok_).typ_;
        local_48 = pCVar7;
        if (uVar5 < 0x2b) {
          if ((0x40001830000U >> (uVar5 & 0x3f) & 1) == 0) {
            if (uVar5 == 0x14) goto LAB_00230be0;
            if (uVar5 == 0x15) {
              CTcTokenizer::next(G_tok);
              iVar8 = 0;
              goto LAB_00230cb6;
            }
            goto LAB_00230cd7;
          }
          CTcTokenizer::log_error_curtok(G_tok,0x2ba5);
        }
        else {
LAB_00230cd7:
          CTcTokenizer::log_error_curtok(G_tok,0x2ba4);
          if ((G_tok->curtok_).typ_ != TOKT_EOF) {
            iVar8 = 0;
            goto LAB_00230cb6;
          }
        }
        unaff_R14 = (CTPNArglist *)CTcPrsMem::alloc(G_prsmem,0x18);
        (unaff_R14->super_CTPNArglistBase).argc_ = local_3c;
        (unaff_R14->super_CTPNArglistBase).list_ = pCVar7;
        (unaff_R14->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase.
        _vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0035ba88;
      }
    }
LAB_00230cb6:
    pCVar6 = pCVar4;
    if (iVar8 != 0) {
      if (iVar8 == 2) {
        CTcTokenizer::next(G_tok);
        unaff_R14 = (CTPNArglist *)CTcPrsMem::alloc(G_prsmem,0x18);
        (unaff_R14->super_CTPNArglistBase).argc_ = local_3c;
        (unaff_R14->super_CTPNArglistBase).list_ = local_48;
        (unaff_R14->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase.
        _vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0035ba88;
      }
      return unaff_R14;
    }
  } while( true );
}

Assistant:

CTPNArglist *CTcPrsOpBinGroupCompare::parse_inlist() const
{
    int argc;
    CTPNArg *arg_head;
    CTPNArg *arg_tail;

    /* skip the second keyword token, and check for an open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the paren */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and keep going on the assumption that it was
         *   merely omitted and the rest of the list is well-formed 
         */
        G_tok->log_error_curtok(TCERR_IN_REQ_LPAR);
    }

    /* keep going until we find the close paren */
    for (argc = 0, arg_head = arg_tail = 0 ;; )
    {
        CTcPrsNode *expr;
        CTPNArg *arg_cur;

        /* if this is the close paren, we're done */
        if (G_tok->cur() == TOKT_RPAR)
            break;

        /* parse this expression */
        expr = S_op_asi.parse();
        if (expr == 0)
            return 0;

        /* count the argument */
        ++argc;

        /* create a new argument node */
        arg_cur = new CTPNArg(expr);

        /* 
         *   link the new node at the end of our list (this preserves the
         *   order of the original list) 
         */
        if (arg_tail != 0)
            arg_tail->set_next_arg(arg_cur);
        else
            arg_head = arg_cur;
        arg_tail = arg_cur;

        /* we need to be looking at a comma or right paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* that's the end of the list */
            break;
        }
        else if (G_tok->cur() == TOKT_COMMA)
        {
            /* skip the comma and parse the next argument */
            G_tok->next();
        }
        else
        {
            /* 
             *   If we're at the end of the file, there's no point
             *   proceding, so return failure.  If we've reached something
             *   that looks like a statement separator (semicolon, curly
             *   brace), also return failure, since the problem is clearly
             *   a missing right paren.  Otherwise, assume that a comma
             *   was missing and continue as though we have another
             *   argument.  
             */
            switch(G_tok->cur())
            {
            default:
                /* log an error */
                G_tok->log_error_curtok(TCERR_EXPECTED_IN_COMMA);

                /* 
                 *   if we're at the end of file, return what we have so
                 *   far; otherwise continue, assuming that they merely
                 *   left out a comma between two argument expressions 
                 */
                if (G_tok->cur() == TOKT_EOF)
                    return new CTPNArglist(argc, arg_head);
                break;

            case TOKT_SEM:
            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_DSTR_MID:
            case TOKT_DSTR_END:
                /* 
                 *   we're apparently at the end of the statement; flag
                 *   the error as a missing right paren, and return what
                 *   we have so far 
                 */
                G_tok->log_error_curtok(TCERR_EXPECTED_IN_RPAR);
                return new CTPNArglist(argc, arg_head);
            }
        }
    }

    /* skip the closing paren */
    G_tok->next();

    /* create and return the argument list descriptor */
    return new CTPNArglist(argc, arg_head);
}